

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::stringifyDescriptorUpdateMethod_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,DescriptorUpdateMethod method)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "";
    pcVar2 = "";
    break;
  case 1:
    pcVar2 = "with_template";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "with_push";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "with_push_template";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "N/A";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string stringifyDescriptorUpdateMethod(DescriptorUpdateMethod method)
{
	switch (method)
	{
		case DESCRIPTOR_UPDATE_METHOD_NORMAL:
			return "";
			break;

		case DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE:
			return "with_template";
			break;

		case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH:
			return "with_push";
			break;

		case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE:
			return "with_push_template";
			break;

		default:
			return "N/A";
			break;
	}
}